

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-slab-alloc.c
# Opt level: O1

void ztslaballoc_destroy(ztslaballoc_t *sa)

{
  ulong uVar1;
  
  if (sa != (ztslaballoc_t *)0x0) {
    if (sa->nslablistused != 0) {
      uVar1 = 0;
      do {
        free(sa->slablist[uVar1]);
        uVar1 = uVar1 + 1;
      } while (uVar1 < sa->nslablistused);
    }
    free(sa->slablist);
    free(sa);
    return;
  }
  return;
}

Assistant:

void ztslaballoc_destroy(ztslaballoc_t *sa)
{
  size_t i;

  if (sa == NULL)
    return;

  /* FIXME: Free any non-slab allocations */

  /* free all slabs */
  for (i = 0; i < sa->nslablistused; i++)
    free(sa->slablist[i]);

  free(sa->slablist);

  free(sa);
}